

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O1

void __thiscall google::protobuf::FatalException::~FatalException(FatalException *this)

{
  ~FatalException(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

FatalException::~FatalException() throw() {}